

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase * EvaluateSequence(ExpressionEvalContext *ctx,ExprSequence *expression)

{
  uint uVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  int iVar5;
  undefined4 extraout_var;
  ExprBase *pEVar6;
  undefined4 extraout_var_00;
  ulong uVar7;
  
  if (ctx->instructionsLimit <= ctx->instruction) {
    Report(ctx,"ERROR: instruction limit reached");
    return (ExprBase *)0x0;
  }
  ctx->instruction = ctx->instruction + 1;
  pAVar2 = ctx->ctx->allocator;
  iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
  pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar5);
  pSVar3 = (expression->super_ExprBase).source;
  pTVar4 = ctx->ctx->typeVoid;
  pEVar6->typeID = 2;
  pEVar6->source = pSVar3;
  pEVar6->type = pTVar4;
  pEVar6->next = (ExprBase *)0x0;
  pEVar6->listed = false;
  pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240688;
  if ((expression->expressions).count != 0) {
    uVar7 = 0;
    do {
      pEVar6 = Evaluate(ctx,(expression->expressions).data[uVar7]);
      if (pEVar6 == (ExprBase *)0x0) {
        return (ExprBase *)0x0;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (expression->expressions).count);
  }
  uVar1 = (ctx->stackFrames).count;
  if ((uVar1 != 0) && ((ctx->stackFrames).data[uVar1 - 1]->targetYield != 0)) {
    pAVar2 = ctx->ctx->allocator;
    iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var_00,iVar5);
    pSVar3 = (expression->super_ExprBase).source;
    pTVar4 = ctx->ctx->typeVoid;
    pEVar6->typeID = 2;
    pEVar6->source = pSVar3;
    pEVar6->type = pTVar4;
    pEVar6->next = (ExprBase *)0x0;
    pEVar6->listed = false;
    pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240688;
    return pEVar6;
  }
  pEVar6 = CheckType(&expression->super_ExprBase,pEVar6);
  return pEVar6;
}

Assistant:

ExprBase* EvaluateSequence(ExpressionEvalContext &ctx, ExprSequence *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *result = new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	for(unsigned i = 0; i < expression->expressions.size(); i++)
	{
		result = Evaluate(ctx, expression->expressions[i]);

		if(!result)
			return NULL;
	}

	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	return CheckType(expression, result);
}